

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall fmt::v11::detail::bigint::divmod_assign(bigint *this,bigint *divisor)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  bigint *in_RSI;
  bigint *in_RDI;
  bool bVar5;
  bool bVar6;
  bigint *unaff_retaddr;
  int quotient;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  bool in_stack_ffffffffffffffe6;
  bigint *other;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  bVar5 = in_RDI != in_RSI;
  ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffe7,(char (*) [1])0x2c5fea);
  iVar1 = compare(in_RSI,(bigint *)
                         CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffffe6,
                                                 CONCAT24(in_stack_ffffffffffffffe4,
                                                          in_stack_ffffffffffffffe0))));
  if (iVar1 < 0) {
    iVar1 = 0;
  }
  else {
    other = in_RSI;
    sVar3 = buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RSI);
    puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                       ((buffer<unsigned_int> *)in_RSI,sVar3 - 1);
    bVar6 = *puVar4 != 0;
    ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffe6,(char (*) [1])0x2c5fea);
    align(in_RDI,other);
    iVar1 = 0;
    do {
      subtract_aligned(unaff_retaddr,
                       (bigint *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      iVar1 = iVar1 + 1;
      iVar2 = compare(other,(bigint *)
                            CONCAT17(bVar5,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffe4,iVar1))
                                    ));
    } while (-1 < iVar2);
  }
  return iVar1;
}

Assistant:

FMT_CONSTEXPR auto divmod_assign(const bigint& divisor) -> int {
    FMT_ASSERT(this != &divisor, "");
    if (compare(*this, divisor) < 0) return 0;
    FMT_ASSERT(divisor.bigits_[divisor.bigits_.size() - 1u] != 0, "");
    align(divisor);
    int quotient = 0;
    do {
      subtract_aligned(divisor);
      ++quotient;
    } while (compare(*this, divisor) >= 0);
    return quotient;
  }